

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_sha256sum(uchar *tmp,size_t tmplen,uchar *sha256sum,size_t unused)

{
  uint in_EAX;
  CURLcode CVar1;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  uint len;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    type = EVP_sha256();
    EVP_DigestInit(ctx,type);
    EVP_DigestUpdate(ctx,tmp,tmplen);
    EVP_DigestFinal_ex(ctx,sha256sum,(uint *)((long)&uStack_28 + 4));
    EVP_MD_CTX_free(ctx);
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode ossl_sha256sum(const unsigned char *tmp, /* input */
                               size_t tmplen,
                               unsigned char *sha256sum /* output */,
                               size_t unused)
{
  EVP_MD_CTX *mdctx;
  unsigned int len = 0;
  (void) unused;

  mdctx = EVP_MD_CTX_create();
  if(!mdctx)
    return CURLE_OUT_OF_MEMORY;
  EVP_DigestInit(mdctx, EVP_sha256());
  EVP_DigestUpdate(mdctx, tmp, tmplen);
  EVP_DigestFinal_ex(mdctx, sha256sum, &len);
  EVP_MD_CTX_destroy(mdctx);
  return CURLE_OK;
}